

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O3

bool find_in_list(Am_Value *list_value,int ID)

{
  char cVar1;
  undefined1 uVar2;
  Am_Value_List list;
  Am_Value_List aAStack_28 [16];
  
  cVar1 = Am_Value::Valid();
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    Am_Value_List::Am_Value_List(aAStack_28,list_value);
    Am_Value_List::Start();
    uVar2 = Am_Value_List::Member((int)aAStack_28);
    Am_Value_List::~Am_Value_List(aAStack_28);
  }
  return (bool)uVar2;
}

Assistant:

bool
find_in_list(Am_Value list_value, int ID)
{
  if (!list_value.Valid())
    return false;                  // nothing selected
  Am_Value_List list = list_value; // otherwise it is a value list
  list.Start();
  return list.Member(ID);
}